

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

Optional<llbuild::buildsystem::BuildValue> * __thiscall
anon_unknown.dwarf_643cf::BuildSystemImpl::build
          (Optional<llbuild::buildsystem::BuildValue> *__return_storage_ptr__,BuildSystemImpl *this,
          BuildKey *key)

{
  StringRef filename;
  int iVar1;
  ValueType *__x;
  ValueType result;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  BuildValue local_98;
  
  iVar1 = llbuild::basic::sys::raiseOpenFileLimit(0x800);
  if (iVar1 == 0) {
    this->buildWasAborted = false;
    std::__cxx11::string::string((string *)&local_98,(string *)key);
    __x = llbuild::core::BuildEngine::build(&this->buildEngine,(KeyType *)&local_98);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0,__x);
    std::__cxx11::string::_M_dispose();
    llvm::
    StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
    ::clear(&this->shellHandlers);
    if (this->buildWasAborted == true) {
      (__return_storage_ptr__->Storage).hasVal = false;
    }
    else {
      llbuild::buildsystem::BuildValue::fromData(&local_98,(ValueType *)&local_b0);
      llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::
      OptionalStorage(&__return_storage_ptr__->Storage,&local_98);
      llbuild::buildsystem::BuildValue::~BuildValue(&local_98);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b0);
  }
  else {
    filename.Data = (this->mainFilename)._M_dataplus._M_p;
    filename.Length = (this->mainFilename)._M_string_length;
    llvm::Twine::Twine((Twine *)&local_98,"failed to raise open file limit");
    error(this,filename,(Twine *)&local_98);
    (__return_storage_ptr__->Storage).hasVal = false;
  }
  return __return_storage_ptr__;
}

Assistant:

llvm::Optional<BuildValue> BuildSystemImpl::build(BuildKey key) {

  if (basic::sys::raiseOpenFileLimit() != 0) {
    error(getMainFilename(), "failed to raise open file limit");
    return None;
  }

  // Build the target.
  buildWasAborted = false;
  auto result = buildEngine.build(key.toData());
    
  // Clear out the shell handlers, as we do not want to hold on to them across
  // multiple builds.
  shellHandlers.clear();

  if (buildWasAborted)
    return None;
  return BuildValue::fromData(result);
}